

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O3

void __thiscall bloaty::ObjectFile::set_debug_file(ObjectFile *this,ObjectFile *file)

{
  int iVar1;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  (*this->debug_file_->_vptr_ObjectFile[2])(&local_58);
  (*this->_vptr_ObjectFile[2])(&local_38,this);
  if (local_50 == local_30) {
    if (local_50 != 0) {
      iVar1 = bcmp(local_58,local_38,local_50);
      if (iVar1 != 0) goto LAB_0018bd8d;
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    this->debug_file_ = file;
    return;
  }
LAB_0018bd8d:
  __assert_fail("debug_file_->GetBuildId() == GetBuildId()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.h",
                0x11a,"void bloaty::ObjectFile::set_debug_file(const ObjectFile *)");
}

Assistant:

void set_debug_file(const ObjectFile* file) {
    assert(debug_file_->GetBuildId() == GetBuildId());
    debug_file_ = file;
  }